

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3unas.cpp
# Opt level: O1

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src,CTcUnasOut *out,char ch_op)

{
  ushort uVar1;
  undefined2 uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar7;
  undefined4 extraout_var_07;
  long lVar8;
  undefined4 uVar9;
  undefined7 in_register_00000011;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  char ch [10];
  char name [128];
  byte local_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined1 local_d8;
  undefined2 local_d7;
  CTcUnasOut *local_d0;
  uint local_c4;
  long local_c0;
  char local_b8 [136];
  undefined4 extraout_var_06;
  
  (*src->_vptr_CTcUnasSrc[3])();
  uVar12 = (ulong)(byte)ch_op;
  iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
  (**(code **)(*(long *)out + 0x10))
            (out,"%8lx  %-14.14s ",CONCAT44(extraout_var,iVar4) + -1,instr_info[uVar12].nm);
  iVar4 = (int)CONCAT71(in_register_00000011,ch_op);
  local_d0 = out;
  if (iVar4 == -0x70) {
    (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
    (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
    uVar1 = CONCAT11(uStack_db,local_dc);
    (**(code **)(*(long *)out + 0x10))(out,"0x%x\n",uVar1);
    uVar14 = (uint)uVar1;
    if (uVar1 != 0) {
      while( true ) {
        uVar14 = uVar14 - 1;
        iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
        lVar17 = CONCAT44(extraout_var_00,iVar4);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
        (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
        (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
        (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_d8);
        (*src->_vptr_CTcUnasSrc[2])(src,&local_d7);
        (*src->_vptr_CTcUnasSrc[2])(src,(long)&local_d7 + 1);
        iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
        if (CONCAT44(extraout_var_01,iVar4) == lVar17) break;
        pcVar15 = "nil";
        pcVar10 = "";
        local_c4 = uVar14;
        local_c0 = lVar17;
        switch(local_dc) {
        case 1:
          break;
        case 2:
          pcVar15 = "true";
          pcVar10 = "";
          break;
        default:
          pcVar10 = "???";
          pcVar15 = "???";
          break;
        case 5:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%08lx",
                  (ulong)CONCAT13(local_d8,CONCAT12(uStack_d9,CONCAT11(uStack_da,uStack_db))));
          pcVar15 = "object";
          break;
        case 6:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%04x",(ulong)CONCAT11(uStack_da,uStack_db));
          pcVar15 = "prop";
          break;
        case 7:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%08lx",
                  (ulong)CONCAT13(local_d8,CONCAT12(uStack_d9,CONCAT11(uStack_da,uStack_db))));
          pcVar15 = "int";
          break;
        case 8:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%08lx",
                  (ulong)CONCAT13(local_d8,CONCAT12(uStack_d9,CONCAT11(uStack_da,uStack_db))));
          pcVar15 = "sstring";
          break;
        case 10:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%08lx",
                  (ulong)CONCAT13(local_d8,CONCAT12(uStack_d9,CONCAT11(uStack_da,uStack_db))));
          pcVar15 = "list";
          break;
        case 0xc:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%08lx",
                  (ulong)CONCAT13(local_d8,CONCAT12(uStack_d9,CONCAT11(uStack_da,uStack_db))));
          pcVar15 = "funcptr";
          break;
        case 0xf:
          pcVar10 = local_b8;
          sprintf(pcVar10,"0x%08lx",
                  (ulong)CONCAT13(local_d8,CONCAT12(uStack_d9,CONCAT11(uStack_da,uStack_db))));
          pcVar15 = "enum";
        }
        iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
        sVar3 = local_d7;
        iVar6 = (*src->_vptr_CTcUnasSrc[3])(src);
        (**(code **)(*(long *)local_d0 + 0x10))
                  (local_d0,"          0x%08lx      %-8.8s(%-10.10s) -> +0x%04lx (0x%08lx)\n",
                   CONCAT44(extraout_var_02,iVar5) + -7,pcVar15,pcVar10,sVar3,
                   CONCAT44(extraout_var_03,iVar6) + (long)local_d7 + -2);
        if ((CONCAT44(extraout_var_01,iVar4) == local_c0) || (uVar14 = local_c4, local_c4 == 0))
        break;
      }
    }
    (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
    (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
    iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
    uVar2 = CONCAT11(uStack_db,local_dc);
    iVar5 = (*src->_vptr_CTcUnasSrc[3])(src);
    (**(code **)(*(long *)local_d0 + 0x10))
              (local_d0,"          0x%08lx      default              -> +0x%04lx (0x%08lx)\n",
               CONCAT44(extraout_var_04,iVar4) + -2,uVar2,
               CONCAT44(extraout_var_05,iVar5) + (long)CONCAT11(uStack_db,local_dc) + -2);
  }
  else {
    if (iVar4 == 0x57) {
      (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
      (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
      (**(code **)(*(long *)out + 0x10))
                (out,"len=0x%x, cnt=0x%x [",CONCAT11(uStack_db,local_dc),local_dc);
      local_c4 = (uint)local_dc;
      if (local_c4 != 0) {
        uVar14 = 0;
        do {
          (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
          (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
          uVar16 = (uint)CONCAT11(uStack_db,local_dc);
          if (CONCAT11(uStack_db,local_dc) == 0) {
            uVar12 = 0;
          }
          else {
            uVar13 = 0x80;
            if (uVar16 < 0x80) {
              uVar13 = (ulong)uVar16;
            }
            uVar12 = 0;
            do {
              (*src->_vptr_CTcUnasSrc[2])(src,local_b8 + uVar12);
              uVar12 = uVar12 + 1;
            } while (uVar13 != uVar12);
          }
          pcVar10 = ", ";
          if (uVar14 == 0) {
            pcVar10 = ":";
          }
          (**(code **)(*(long *)local_d0 + 0x10))
                    (local_d0,"%s%.*s",pcVar10,uVar12 & 0xffffffff,local_b8);
          iVar4 = uVar16 - (uint)uVar12;
          if ((uint)uVar12 <= uVar16 && iVar4 != 0) {
            do {
              (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_c4);
      }
      lVar17 = *(long *)local_d0;
      pcVar10 = "]";
      out = local_d0;
    }
    else {
      if (0 < instr_info[uVar12].op_cnt) {
        lVar17 = 0;
        do {
          if (lVar17 != 0) {
            (**(code **)(*(long *)out + 0x10))(out,", ");
          }
          switch(*(undefined4 *)(uVar12 * 0x18 + 0x3830dc + lVar17 * 4)) {
          case 0:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            uVar14 = (uint)(char)local_dc;
            goto LAB_002503f2;
          case 1:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            uVar14 = (uint)local_dc;
            goto LAB_002503f2;
          case 2:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            uVar14 = (uint)CONCAT11(uStack_db,local_dc);
            goto LAB_002503f2;
          case 3:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            uVar14 = (uint)CONCAT11(uStack_db,local_dc);
LAB_002503f2:
            lVar8 = *(long *)out;
            pcVar10 = "0x%x";
LAB_00250400:
            (**(code **)(lVar8 + 0x10))(out,pcVar10,uVar14);
            goto LAB_0025052d;
          case 4:
          case 5:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
            uVar9 = CONCAT13(uStack_d9,CONCAT12(uStack_da,CONCAT11(uStack_db,local_dc)));
            lVar8 = *(long *)out;
            pcVar10 = "0x%lx";
            break;
          case 6:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
            uVar9 = CONCAT13(uStack_d9,CONCAT12(uStack_da,CONCAT11(uStack_db,local_dc)));
            lVar8 = *(long *)out;
            pcVar10 = "string(0x%lx)";
            break;
          case 7:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
            uVar9 = CONCAT13(uStack_d9,CONCAT12(uStack_da,CONCAT11(uStack_db,local_dc)));
            lVar8 = *(long *)out;
            pcVar10 = "list(0x%lx)";
            break;
          case 8:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
            uVar9 = CONCAT13(uStack_d9,CONCAT12(uStack_da,CONCAT11(uStack_db,local_dc)));
            lVar8 = *(long *)out;
            pcVar10 = "code(0x%08lx)";
            break;
          case 9:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            sVar3 = CONCAT11(uStack_db,local_dc);
            uVar13 = (ulong)sVar3;
            if ((long)uVar13 < 0) {
              iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
              lVar7 = CONCAT44(extraout_var_07,iVar4);
              lVar8 = *(long *)local_d0;
              pcVar10 = "-0x%04x (0x%08lx)";
              uVar11 = (ulong)(uint)-(int)sVar3;
              out = local_d0;
            }
            else {
              iVar4 = (*src->_vptr_CTcUnasSrc[3])(src);
              lVar7 = CONCAT44(extraout_var_06,iVar4);
              lVar8 = *(long *)out;
              pcVar10 = "+0x%04x (0x%08lx)";
              uVar11 = uVar13 & 0xffffffff;
            }
            (**(code **)(lVar8 + 0x10))(out,pcVar10,uVar11,uVar13 + lVar7 + -2);
            goto LAB_0025052d;
          case 10:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
            uVar9 = CONCAT13(uStack_d9,CONCAT12(uStack_da,CONCAT11(uStack_db,local_dc)));
            lVar8 = *(long *)out;
            pcVar10 = "object(0x%lx)";
            break;
          case 0xb:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            uVar14 = (uint)CONCAT11(uStack_db,local_dc);
            lVar8 = *(long *)out;
            pcVar10 = "property(0x%x)";
            goto LAB_00250400;
          case 0xc:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_da);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_d9);
            uVar9 = CONCAT13(uStack_d9,CONCAT12(uStack_da,CONCAT11(uStack_db,local_dc)));
            lVar8 = *(long *)out;
            pcVar10 = "enum(0x%lx)";
            break;
          case 0xd:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            if (local_dc == 3) {
              lVar8 = *(long *)out;
              pcVar10 = "definingobj";
            }
            else if (local_dc == 2) {
              lVar8 = *(long *)out;
              pcVar10 = "targetobj";
            }
            else {
              if (local_dc != 1) {
                uVar14 = (uint)(char)local_dc;
                goto LAB_002503f2;
              }
              lVar8 = *(long *)out;
              pcVar10 = "targetprop";
            }
            goto LAB_00250356;
          case 0xe:
            (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            (*src->_vptr_CTcUnasSrc[2])(src,&uStack_db);
            (**(code **)(*(long *)out + 0x10))(out,"string(inline)");
            for (uVar13 = (ulong)CONCAT11(uStack_db,local_dc); uVar13 != 0; uVar13 = uVar13 - 1) {
              (*src->_vptr_CTcUnasSrc[2])(src,&local_dc);
            }
            goto LAB_0025052d;
          default:
            lVar8 = *(long *)out;
            pcVar10 = "...unknown type...";
LAB_00250356:
            (**(code **)(lVar8 + 0x10))(out,pcVar10);
            goto LAB_0025052d;
          }
          (**(code **)(lVar8 + 0x10))(out,pcVar10,uVar9);
LAB_0025052d:
          lVar17 = lVar17 + 1;
        } while (lVar17 < instr_info[uVar12].op_cnt);
      }
      lVar17 = *(long *)out;
      pcVar10 = "\n";
    }
    (**(code **)(lVar17 + 0x10))(out,pcVar10);
  }
  return;
}

Assistant:

void CTcT3Unasm::disasm_instr(CTcUnasSrc *src, CTcUnasOut *out, char ch_op)
{
    t3_instr_info_t *info;
    int i;
    ulong acc;
    char ch[10];
    ulong prv_ofs = src->get_ofs();
    
    /* get the information on this instruction */
    info = &instr_info[(int)(uchar)ch_op];
    out->print("%8lx  %-14.14s ", src->get_ofs() - 1, info->nm);

    /* check the instruction type */
    switch((uchar)ch_op)
    {
    case OPC_SWITCH:
        /* 
         *   It's a switch instruction - special handling is required,
         *   since this instruction doesn't fit any of the normal
         *   patterns.  First, get the number of elements in the case
         *   table - this is a UINT2 value at the start of the table.  
         */
        src->next_byte(ch);
        src->next_byte(ch+1);
        acc = osrp2(ch);

        /* display the count */
        out->print("0x%x\n", (uint)acc);

        /* display the table */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            const char *dt;
            char valbuf[128];
            const char *val = valbuf;

            /* note the current offset */
            prv_ofs = src->get_ofs();
            
            /* read the DATAHOLDER value */
            src->next_byte(ch);
            src->next_byte(ch+1);
            src->next_byte(ch+2);
            src->next_byte(ch+3);
            src->next_byte(ch+4);

            /* read the jump offset */
            src->next_byte(ch+5);
            src->next_byte(ch+6);

            /* 
             *   stop looping if the offset hasn't changed - this probably
             *   means we're stuck trying to interpret as a "switch" some
             *   data at the end of the stream that happens to look like a
             *   switch but really isn't (such as an exception table, or
             *   debug records) 
             */
            if (src->get_ofs() == prv_ofs)
                break;

            /* show the value */
            switch(ch[0])
            {
            case VM_NIL:
                dt = "nil";
                val = "";
                break;
                
            case VM_TRUE:
                dt = "true";
                val = "";
                break;
                
            case VM_OBJ:
                dt = "object";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_PROP:
                dt = "prop";
                sprintf(valbuf, "0x%04x", osrp2(ch+1));
                break;
                
            case VM_INT:
                dt = "int";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            case VM_ENUM:
                dt = "enum";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_SSTRING:
                dt = "sstring";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_LIST:
                dt = "list";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;
                
            case VM_FUNCPTR:
                dt = "funcptr";
                sprintf(valbuf, "0x%08lx", t3rp4u(ch+1));
                break;

            default:
                dt = "???";
                val = "???";
                break;
            }

            /* show the slot data */
            out->print("          0x%08lx      %-8.8s(%-10.10s) "
                       "-> +0x%04lx (0x%08lx)\n",
                       src->get_ofs() - 7, dt, val, osrp2(ch+5),
                       src->get_ofs() - 2 + osrp2s(ch+5));
        }

        /* read and show the 'default' jump offset */
        src->next_byte(ch);
        src->next_byte(ch+1);
        out->print("          0x%08lx      default              "
                   "-> +0x%04lx (0x%08lx)\n",
                   src->get_ofs() - 2, osrp2(ch),
                   src->get_ofs() - 2 + osrp2s(ch));

        /* done */
        break;

    case OPC_NAMEDARGTAB:
        /* named argument table */
        src->next_byte(ch);
        src->next_byte(ch+1);
        src->next_byte(ch+2);
        acc = osrp2(ch);
        out->print("len=0x%x, cnt=0x%x [", (uint)acc, (uint)(uchar)*ch);
        acc = (uchar)*ch;

        /* show the names */
        for (i = 0 ; i < (int)acc ; ++i)
        {
            /* get the length */
            src->next_byte(ch);
            src->next_byte(ch);
            uint len = osrp2(ch);

            /* get the name */
            char name[128];
            uint j;
            for (j = 0 ; j < len && j < sizeof(name) ; ++j)
                src->next_byte(name + j);

            /* show the name */
            out->print("%s%.*s", i > 0 ? ", " : ":", (int)j, name);

            /* skip any excess portion of the name */
            for ( ; j < len ; ++j)
                src->next_byte(ch);
        }

        /* end the list, and we're done */
        out->print("]");
        break;

    default:
        /* show all parameters */
        for (i = 0 ; i < info->op_cnt ; ++i)
        {
            /* add a separator if this isn't the first one */
            if (i != 0)
                out->print(", ");
            
            /* display the operand */
            switch(info->op_type[i])
            {
            case T3OP_TYPE_8S:
                /* 8-bit signed integer */
                src->next_byte(ch);
                out->print("0x%x", (int)ch[0]);
                break;

            case T3OP_TYPE_8U:
                /* 8-bit unsigned integer */
                src->next_byte(ch);
                out->print("0x%x", (uint)(uchar)ch[0]);
                break;

            case T3OP_TYPE_16S:
                /* 16-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                out->print("0x%x", (int)acc);
                break;

            case T3OP_TYPE_16U:
                /* 16-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("0x%x", (uint)acc);
                break;

            case T3OP_TYPE_32S:
                /* 32-bit signed integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_32U:
                /* 32-bit unsigned integer */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("0x%lx", acc);
                break;

            case T3OP_TYPE_STR:
                /* string offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("string(0x%lx)", acc);
                break;

            case T3OP_TYPE_LIST:
                /* list offset */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("list(0x%lx)", acc);
                break;

            case T3OP_TYPE_CODE_ABS:
                /* 32-bit absolute code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("code(0x%08lx)", acc);
                break;

            case T3OP_TYPE_CODE_REL:
                /* 16-bit relative code address */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2s(ch);
                if ((long)acc < 0)
                    out->print("-0x%04x (0x%08lx)",
                               -(int)acc, src->get_ofs() - 2 + acc);
                else
                    out->print("+0x%04x (0x%08lx)",
                               (int)acc, src->get_ofs() - 2 + acc);
                break;

            case T3OP_TYPE_OBJ:
                /* object ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("object(0x%lx)", acc);
                break;

            case T3OP_TYPE_PROP:
                /* property ID */
                src->next_byte(ch);
                src->next_byte(ch+1);
                acc = osrp2(ch);
                out->print("property(0x%x)", (uint)acc);
                break;

            case T3OP_TYPE_ENUM:
                /* enum */
                src->next_byte(ch);
                src->next_byte(ch+1);
                src->next_byte(ch+2);
                src->next_byte(ch+3);
                acc = t3rp4u(ch);
                out->print("enum(0x%lx)", acc);
                break;

            case T3OP_TYPE_CTX_ELE:
                /* context element identifier */
                src->next_byte(ch);
                switch(ch[0])
                {
                case PUSHCTXELE_TARGPROP:
                    out->print("targetprop");
                    break;

                case PUSHCTXELE_TARGOBJ:
                    out->print("targetobj");
                    break;

                case PUSHCTXELE_DEFOBJ:
                    out->print("definingobj");
                    break;

                default:
                    out->print("0x%x", (int)ch[0]);
                    break;
                }
                break;

            case T3OP_TYPE_INLINE_STR:
                /* get the string length */
                src->next_byte(ch);
                src->next_byte(ch+1);

                /* show it */
                out->print("string(inline)");

                /* skip the string */
                for (acc = osrp2(ch) ; acc != 0 ; --acc)
                    src->next_byte(ch);

                /* done */
                break;

            default:
                out->print("...unknown type...");
                break;
            }
        }

        /* end the line */
        out->print("\n");
    }
}